

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::NegativeTest::testClipDistancesRedeclarationBuildingErrors
          (NegativeTest *this,Functions *gl)

{
  ostringstream *this_00;
  Program program;
  allocator<char> local_25a;
  allocator<char> local_259;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  Program local_218;
  undefined1 local_198 [384];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,m_vertex_shader_code_case_2,&local_259);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,m_fragment_shader_code,&local_25a);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Utility::Program::Program(&local_218,gl,(string *)local_198,&local_238,&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)local_198);
  if (local_218.m_program_status.program_id != 0) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Functional test have passed but with warning. Building shader without explicit redeclaration and with variable indexing has unexpectedly succeeded. This is within the bound of the specification (no error is being), but it may lead to errors."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  Utility::Program::~Program(&local_218);
  return local_218.m_program_status.program_id == 0;
}

Assistant:

bool gl3cts::ClipDistance::NegativeTest::testClipDistancesRedeclarationBuildingErrors(const glw::Functions& gl)
{
	/* Check that building shader program fails when gl_ClipDistance is not
	 redeclared with explicit size and dynamic indexing is used.*/

	gl3cts::ClipDistance::Utility::Program program(gl, m_vertex_shader_code_case_2, m_fragment_shader_code);

	if (program.ProgramStatus().program_id)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Functional test have passed but with warning. "
			   "Building shader without explicit redeclaration and with variable indexing has unexpectedly succeeded. "
			   "This is within the bound of the specification (no error is being), but it may lead to errors."
			<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}